

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::UnaryOperatorWrapper,duckdb::NegateOperator>
               (uhugeint_t *ldata,uhugeint_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  uint64_t *puVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  uint64_t uVar3;
  uint64_t uVar4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  unsigned_long uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uhugeint_t uVar11;
  uhugeint_t local_78;
  ValidityMask *local_60;
  uhugeint_t *local_58;
  idx_t local_50;
  ulong local_48;
  ulong local_40;
  idx_t local_38;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_60 = mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar7 = 0;
      do {
        puVar1 = (uint64_t *)((long)&ldata->lower + lVar7);
        local_78.lower = *puVar1;
        local_78.upper = puVar1[1];
        uVar11 = uhugeint_t::operator-(&local_78);
        *(uint64_t *)((long)&result_data->lower + lVar7) = uVar11.lower;
        *(uint64_t *)((long)&result_data->upper + lVar7) = uVar11.upper;
        lVar7 = lVar7 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    local_50 = count;
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_78,(unsigned_long **)mask,&local_38);
      uVar4 = local_78.upper;
      uVar3 = local_78.lower;
      local_78.lower = 0;
      local_78.upper = 0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar3;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.upper !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.upper);
      }
      pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar5->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      count = local_50;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_48 = count + 0x3f >> 6;
      local_40 = 0;
      uVar9 = 0;
      local_58 = ldata;
      do {
        puVar2 = (local_60->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar6 = 0xffffffffffffffff;
        }
        else {
          uVar6 = puVar2[local_40];
        }
        uVar10 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar10 = count;
        }
        uVar8 = uVar10;
        if (uVar6 != 0) {
          uVar8 = uVar9;
          if (uVar6 == 0xffffffffffffffff) {
            if (uVar9 < uVar10) {
              lVar7 = uVar9 << 4;
              do {
                puVar1 = (uint64_t *)((long)&ldata->lower + lVar7);
                local_78.lower = *puVar1;
                local_78.upper = puVar1[1];
                uVar11 = uhugeint_t::operator-(&local_78);
                *(uint64_t *)((long)&result_data->lower + lVar7) = uVar11.lower;
                *(uint64_t *)((long)&result_data->upper + lVar7) = uVar11.upper;
                uVar9 = uVar9 + 1;
                lVar7 = lVar7 + 0x10;
                uVar8 = uVar9;
              } while (uVar10 != uVar9);
            }
          }
          else {
            ldata = local_58;
            if (uVar9 < uVar10) {
              lVar7 = uVar9 << 4;
              uVar8 = 0;
              do {
                if ((uVar6 >> (uVar8 & 0x3f) & 1) != 0) {
                  puVar1 = (uint64_t *)((long)&local_58->lower + lVar7);
                  local_78.lower = *puVar1;
                  local_78.upper = puVar1[1];
                  uVar11 = uhugeint_t::operator-(&local_78);
                  *(uint64_t *)((long)&result_data->lower + lVar7) = uVar11.lower;
                  *(uint64_t *)((long)&result_data->upper + lVar7) = uVar11.upper;
                }
                uVar8 = uVar8 + 1;
                lVar7 = lVar7 + 0x10;
              } while ((uVar9 - uVar10) + uVar8 != 0);
              count = local_50;
              uVar8 = uVar9 + uVar8;
              ldata = local_58;
            }
          }
        }
        local_40 = local_40 + 1;
        uVar9 = uVar8;
      } while (local_40 != local_48);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}